

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O0

AudioBackend_Sound * AudioBackend_CreateSound(uint frequency,size_t frames)

{
  uchar *puVar1;
  AudioBackend_Sound *sound;
  size_t frames_local;
  AudioBackend_Sound *pAStack_10;
  uint frequency_local;
  
  pAStack_10 = (AudioBackend_Sound *)malloc(0x48);
  if (pAStack_10 == (AudioBackend_Sound *)0x0) {
    pAStack_10 = (AudioBackend_Sound *)0x0;
  }
  else {
    puVar1 = (uchar *)malloc(frames + 1);
    pAStack_10->samples = puVar1;
    if (pAStack_10->samples == (uchar *)0x0) {
      free(pAStack_10);
      pAStack_10 = (AudioBackend_Sound *)0x0;
    }
    else {
      pAStack_10->frames = frames;
      pAStack_10->playing = false;
      pAStack_10->position = 0.0;
      SetSoundFrequency(pAStack_10,frequency);
      SetSoundVolume(pAStack_10,0);
      SetSoundPan(pAStack_10,0);
      ma_mutex_lock(&mutex);
      pAStack_10->next = sound_list_head;
      sound_list_head = pAStack_10;
      ma_mutex_unlock(&mutex);
    }
  }
  return pAStack_10;
}

Assistant:

AudioBackend_Sound* AudioBackend_CreateSound(unsigned int frequency, size_t frames)
{
	AudioBackend_Sound *sound = (AudioBackend_Sound*)malloc(sizeof(AudioBackend_Sound));

	if (sound == NULL)
		return NULL;

	sound->samples = (unsigned char*)malloc(frames + 1);

	if (sound->samples == NULL)
	{
		free(sound);
		return NULL;
	}

	sound->frames = frames;
	sound->playing = FALSE;
	sound->position = 0.0;

	SetSoundFrequency(sound, frequency);
	SetSoundVolume(sound, 0);
	SetSoundPan(sound, 0);

	ma_mutex_lock(&mutex);

	sound->next = sound_list_head;
	sound_list_head = sound;

	ma_mutex_unlock(&mutex);

	return sound;
}